

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

int archive_read_format_mtree_options(archive_read *a,char *key,char *val)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  pvVar1 = a->format->data;
  iVar2 = strcmp(key,"checkfs");
  iVar3 = -0x14;
  if (iVar2 == 0) {
    iVar3 = 0;
    if (val == (char *)0x0) {
      bVar4 = false;
    }
    else {
      bVar4 = *val != '\0';
    }
    *(bool *)((long)pvVar1 + 0x90) = bVar4;
  }
  return iVar3;
}

Assistant:

static int
archive_read_format_mtree_options(struct archive_read *a,
    const char *key, const char *val)
{
	struct mtree *mtree;

	mtree = (struct mtree *)(a->format->data);
	if (strcmp(key, "checkfs")  == 0) {
		/* Allows to read information missing from the mtree from the file system */
		if (val == NULL || val[0] == 0) {
			mtree->checkfs = 0;
		} else {
			mtree->checkfs = 1;
		}
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}